

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  uchar *__ptr;
  undefined8 *puVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uchar *puVar13;
  
  if (req_comp == img_n) {
    return data;
  }
  __ptr = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
  if (__ptr == (uchar *)0x0) {
    free(data);
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_00162d50);
    pcVar7 = "outofmem";
LAB_00132fd8:
    *puVar5 = pcVar7;
    __ptr = (uchar *)0x0;
  }
  else {
    if (0 < (int)y) {
      uVar4 = req_comp + img_n * 8;
      if ((0x23 < uVar4) || ((0xe161a1c00U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) {
        free(data);
        free(__ptr);
        puVar5 = (undefined8 *)__tls_get_addr(&PTR_00162d50);
        pcVar7 = "unsupported";
        goto LAB_00132fd8;
      }
      iVar1 = x - 1;
      uVar11 = 0;
      uVar10 = 0;
      uVar8 = 0;
      do {
        iVar12 = (int)uVar8 * x;
        if (uVar4 - 10 < 0x19) {
          pbVar9 = data + (uint)(iVar12 * img_n);
          switch(uVar4) {
          case 10:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                __ptr[lVar6 * 2 + uVar10] = data[lVar6 + uVar11];
                __ptr[lVar6 * 2 + uVar10 + 1] = 0xff;
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          case 0xb:
            if (-1 < iVar1) {
              puVar13 = __ptr + uVar10 + 2;
              lVar6 = 0;
              do {
                uVar3 = data[lVar6 + uVar11];
                *puVar13 = uVar3;
                puVar13[-1] = uVar3;
                puVar13[-2] = uVar3;
                lVar6 = lVar6 + 1;
                puVar13 = puVar13 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0xc:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                uVar3 = data[lVar6 + uVar11];
                __ptr[lVar6 * 4 + uVar10 + 2] = uVar3;
                __ptr[lVar6 * 4 + uVar10 + 1] = uVar3;
                __ptr[lVar6 * 4 + uVar10] = uVar3;
                __ptr[lVar6 * 4 + uVar10 + 3] = 0xff;
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          default:
            goto switchD_00132cf8_caseD_d;
          case 0x11:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                __ptr[lVar6 + uVar10] = data[lVar6 * 2 + uVar11];
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x13:
            if (-1 < iVar1) {
              puVar13 = __ptr + uVar10 + 2;
              lVar6 = 0;
              do {
                uVar3 = data[lVar6 * 2 + uVar11];
                *puVar13 = uVar3;
                puVar13[-1] = uVar3;
                puVar13[-2] = uVar3;
                lVar6 = lVar6 + 1;
                puVar13 = puVar13 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x14:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                uVar3 = data[lVar6 * 2 + uVar11];
                __ptr[lVar6 * 4 + uVar10 + 2] = uVar3;
                __ptr[lVar6 * 4 + uVar10 + 1] = uVar3;
                __ptr[lVar6 * 4 + uVar10] = uVar3;
                __ptr[lVar6 * 4 + uVar10 + 3] = data[lVar6 * 2 + uVar11 + 1];
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x19:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                bVar2 = pbVar9[2];
                __ptr[lVar6 + uVar10] =
                     (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                             (uint)pbVar9[1] * 0x96 + (uint)*pbVar9 * 0x4d >> 8);
                lVar6 = lVar6 + 1;
                pbVar9 = pbVar9 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x1a:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                bVar2 = pbVar9[2];
                __ptr[lVar6 * 2 + uVar10] =
                     (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                             (uint)pbVar9[1] * 0x96 + (uint)*pbVar9 * 0x4d >> 8);
                __ptr[lVar6 * 2 + uVar10 + 1] = 0xff;
                lVar6 = lVar6 + 1;
                pbVar9 = pbVar9 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x1c:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                __ptr[lVar6 * 4 + uVar10] = *pbVar9;
                __ptr[lVar6 * 4 + uVar10 + 1] = pbVar9[1];
                __ptr[lVar6 * 4 + uVar10 + 2] = pbVar9[2];
                __ptr[lVar6 * 4 + uVar10 + 3] = 0xff;
                lVar6 = lVar6 + 1;
                pbVar9 = pbVar9 + 3;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x21:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                bVar2 = data[lVar6 * 4 + uVar11 + 2];
                __ptr[lVar6 + uVar10] =
                     (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                             (uint)data[lVar6 * 4 + uVar11 + 1] * 0x96 +
                             (uint)data[lVar6 * 4 + uVar11] * 0x4d >> 8);
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
            break;
          case 0x22:
            if (-1 < iVar1) {
              lVar6 = 0;
              do {
                bVar2 = data[lVar6 * 4 + uVar11 + 2];
                __ptr[lVar6 * 2 + uVar10] =
                     (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                             (uint)data[lVar6 * 4 + uVar11 + 1] * 0x96 +
                             (uint)data[lVar6 * 4 + uVar11] * 0x4d >> 8);
                __ptr[lVar6 * 2 + uVar10 + 1] = data[lVar6 * 4 + uVar11 + 3];
                lVar6 = lVar6 + 1;
              } while (x != (uint)lVar6);
            }
          }
        }
        else {
switchD_00132cf8_caseD_d:
          if (-1 < iVar1) {
            puVar13 = __ptr + (uint)(iVar12 * req_comp);
            lVar6 = 0;
            do {
              *puVar13 = data[lVar6 * 4 + uVar11];
              puVar13[1] = data[lVar6 * 4 + uVar11 + 1];
              puVar13[2] = data[lVar6 * 4 + uVar11 + 2];
              lVar6 = lVar6 + 1;
              puVar13 = puVar13 + 3;
            } while (x != (uint)lVar6);
          }
        }
        uVar8 = uVar8 + 1;
        uVar10 = (ulong)((int)uVar10 + x * req_comp);
        uVar11 = (ulong)((int)uVar11 + x * img_n);
      } while (uVar8 != y);
    }
    free(data);
  }
  return __ptr;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}